

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

IceTImage icetImageUnpackageFromReceive(IceTVoid *buffer)

{
  IceTSizeType IVar1;
  char *msg;
  int line;
  
  if (*buffer == 0x4d5000) {
    if (*(IceTEnum *)((long)buffer + 4) - 0xc003 < 0xfffffffd) {
      msg = "Invalid image buffer: invalid color format.";
      line = 0x469;
    }
    else if (*(IceTEnum *)((long)buffer + 8) - 0xd002 < 0xfffffffe) {
      msg = "Invalid image buffer: invalid depth format.";
      line = 0x472;
    }
    else {
      IVar1 = icetImageBufferSizeType
                        (*(IceTEnum *)((long)buffer + 4),*(IceTEnum *)((long)buffer + 8),
                         *(IceTSizeType *)((long)buffer + 0xc),
                         *(IceTSizeType *)((long)buffer + 0x10));
      if (IVar1 == *(int *)((long)buffer + 0x18)) {
        *(int *)((long)buffer + 0x14) = *(int *)((long)buffer + 0x10) * *(int *)((long)buffer + 0xc)
        ;
        return (IceTImage)buffer;
      }
      msg = "Inconsistent sizes in image data.";
      line = 0x47b;
    }
  }
  else {
    msg = "Invalid image buffer: no magic number.";
    line = 0x45f;
  }
  icetRaiseDiagnostic(msg,0xfffffffa,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                      ,line);
  return (IceTImage)(IceTVoid *)0x0;
}

Assistant:

IceTImage icetImageUnpackageFromReceive(IceTVoid *buffer)
{
    IceTImage image;
    IceTEnum color_format, depth_format;

    image.opaque_internals = buffer;

  /* Check the image for validity. */
    if (    ICET_IMAGE_HEADER(image)[ICET_IMAGE_MAGIC_NUM_INDEX]
         != ICET_IMAGE_MAGIC_NUM ) {
        icetRaiseError("Invalid image buffer: no magic number.",
                       ICET_INVALID_VALUE);
        image.opaque_internals = NULL;
        return image;
    }

    color_format = icetImageGetColorFormat(image);
    if (    (color_format != ICET_IMAGE_COLOR_RGBA_UBYTE)
         && (color_format != ICET_IMAGE_COLOR_RGBA_FLOAT)
         && (color_format != ICET_IMAGE_COLOR_NONE) ) {
        icetRaiseError("Invalid image buffer: invalid color format.",
                       ICET_INVALID_VALUE);
        image.opaque_internals = NULL;
        return image;
    }

    depth_format = icetImageGetDepthFormat(image);
    if (    (depth_format != ICET_IMAGE_DEPTH_FLOAT)
         && (depth_format != ICET_IMAGE_DEPTH_NONE) ) {
        icetRaiseError("Invalid image buffer: invalid depth format.",
                       ICET_INVALID_VALUE);
        image.opaque_internals = NULL;
        return image;
    }

    if (    icetImageBufferSizeType(color_format, depth_format,
                                    icetImageGetWidth(image),
                                    icetImageGetHeight(image))
         != ICET_IMAGE_HEADER(image)[ICET_IMAGE_ACTUAL_BUFFER_SIZE_INDEX] ) {
        icetRaiseError("Inconsistent sizes in image data.", ICET_INVALID_VALUE);
        image.opaque_internals = NULL;
        return image;
    }

  /* The source may have used a bigger buffer than allocated here at the
     receiver.  Record only size that holds current image. */
    ICET_IMAGE_HEADER(image)[ICET_IMAGE_MAX_NUM_PIXELS_INDEX]
        = (IceTInt)icetImageGetNumPixels(image);

  /* The image is valid (as far as we can tell). */
    return image;
}